

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void drawnumber_getrect(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,
                       t_float basey,int *xp1,int *yp1,int *xp2,int *yp2)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  t_float tVar5;
  t_float tVar6;
  char *newline;
  char *startline;
  char buf [1024];
  uint local_70;
  int height;
  int width;
  int bufsize;
  int fontheight;
  int fontwidth;
  int yloc;
  int xloc;
  t_atom at;
  t_drawnumber *x;
  int *yp1_local;
  int *xp1_local;
  t_float basey_local;
  t_float basex_local;
  t_template *template_local;
  t_word *data_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  tVar5 = fielddesc_getfloat((_fielddesc *)(z + 0xb),template,data,0);
  if ((tVar5 != 0.0) || (NAN(tVar5))) {
    tVar5 = fielddesc_getcoord((_fielddesc *)&z[3].g_next,template,data,0);
    tVar5 = glist_xtopixels(glist,basex + tVar5);
    tVar6 = fielddesc_getcoord((_fielddesc *)(z + 6),template,data,0);
    tVar6 = glist_ytopixels(glist,basey + tVar6);
    iVar1 = glist_fontwidth(glist);
    iVar2 = glist_fontheight(glist);
    drawnumber_getbuf((t_drawnumber *)z,data,template,(char *)&startline);
    local_70 = 0;
    buf[0x3fc] = '\x01';
    buf[0x3fd] = '\0';
    buf[0x3fe] = '\0';
    buf[0x3ff] = '\0';
    newline = (char *)&startline;
    while( true ) {
      pcVar3 = strchr(newline,10);
      if (pcVar3 == (char *)0x0) break;
      if ((long)(int)local_70 < (long)pcVar3 - (long)newline) {
        local_70 = (int)pcVar3 - (int)newline;
      }
      buf._1020_4_ = buf._1020_4_ + 1;
      newline = pcVar3 + 1;
    }
    sVar4 = strlen(newline);
    if (local_70 < sVar4) {
      sVar4 = strlen(newline);
      local_70 = (uint)sVar4;
    }
    *xp1 = (int)tVar5;
    *yp1 = (int)tVar6;
    *xp2 = (int)tVar5 + iVar1 * local_70;
    *yp2 = (int)tVar6 + iVar2 * buf._1020_4_;
  }
  else {
    *yp1 = 0x7fffffff;
    *xp1 = 0x7fffffff;
    *yp2 = -0x7fffffff;
    *xp2 = -0x7fffffff;
  }
  return;
}

Assistant:

static void drawnumber_getrect(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_drawnumber *x = (t_drawnumber *)z;
    t_atom at;
    int xloc, yloc, fontwidth, fontheight, bufsize, width, height;
    char buf[DRAWNUMBER_BUFSIZE], *startline, *newline;

    if (!fielddesc_getfloat(&x->x_vis, template, data, 0))
    {
        *xp1 = *yp1 = 0x7fffffff;
        *xp2 = *yp2 = -0x7fffffff;
        return;
    }
    xloc = glist_xtopixels(glist,
        basex + fielddesc_getcoord(&x->x_xloc, template, data, 0));
    yloc = glist_ytopixels(glist,
        basey + fielddesc_getcoord(&x->x_yloc, template, data, 0));
    fontwidth = glist_fontwidth(glist);
    fontheight = glist_fontheight(glist);
    drawnumber_getbuf(x, data, template, buf);
    width = 0;
    height = 1;
    for (startline = buf; (newline = strchr(startline, '\n'));
        startline = newline+1)
    {
        if (newline - startline > width)
            width = (int)(newline - startline);
        height++;
    }
    if (strlen(startline) > (unsigned)width)
        width = (int)strlen(startline);
    *xp1 = xloc;
    *yp1 = yloc;
    *xp2 = xloc + fontwidth * width;
    *yp2 = yloc + fontheight * height;
}